

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<int>::test_one<(libdivide::Branching)1>
          (DivideTest<int> *this,int numer,int denom,
          divider<int,_(libdivide::Branching)1> *the_divider)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int result;
  int expect;
  uint32_t q_sign;
  uint32_t is_power_of_2;
  int32_t q;
  int32_t magic;
  int32_t sign;
  uint8_t shift;
  uint8_t more;
  int64_t rl;
  int64_t yl;
  int64_t xl;
  string local_b0 [4];
  int in_stack_ffffffffffffff54;
  DivideTest<int> *in_stack_ffffffffffffff58;
  
  iVar2 = std::numeric_limits<int>::min();
  if ((in_ESI != iVar2) || (in_EDX != -1)) {
    bVar1 = *(byte *)(in_RCX + 1) & 0x1f;
    uVar3 = (int)(char)*(byte *)(in_RCX + 1) >> 7;
    iVar2 = in_ESI + (int)((ulong)((long)in_ESI * (long)*in_RCX) >> 0x20);
    iVar2 = ((int)((iVar2 >> 0x1f & (1 << bVar1) - (uint)(*in_RCX == 0)) + iVar2) >> bVar1 ^ uVar3)
            - uVar3;
    if (iVar2 != in_ESI / in_EDX) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      std::operator<<((ostream *)&std::cerr,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,in_ESI);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,in_EDX);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,in_ESI / in_EDX);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }